

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_scope.h
# Opt level: O0

void __thiscall t_scope::resolve_const_value(t_scope *this,t_const_value *const_val,t_type *ttype)

{
  bool bVar1;
  uint uVar2;
  t_const_value_type tVar3;
  t_base tVar4;
  int iVar5;
  t_field *ptVar6;
  undefined4 extraout_var;
  t_const *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  t_type *ptVar8;
  undefined8 *puVar9;
  pointer ppVar10;
  t_const_value *ptVar11;
  reference pptVar12;
  int64_t iVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *__rhs;
  double val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  ostringstream local_3c8 [8];
  ostringstream valstm;
  t_enum_value *enum_value;
  t_enum *tenum;
  t_const_value **local_238;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_230;
  const_iterator v_iter_5;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_2;
  _Base_ptr local_218;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_210;
  const_iterator v_iter_4;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *map_2;
  t_base_type *local_1e0;
  t_type *const_type;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  t_const *local_170;
  t_const *constant;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_d0;
  t_field *local_b0;
  t_field *field;
  _Base_ptr local_a0;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_98;
  const_iterator v_iter_3;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *map_1;
  t_struct *tstruct;
  t_const_value **local_78;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_70;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_1;
  t_const_value **local_58;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_50;
  const_iterator v_iter_1;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_30;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *map;
  t_type *ttype_local;
  t_const_value *const_val_local;
  t_scope *this_local;
  
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
      if ((uVar2 & 1) == 0) {
        uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])();
        if ((uVar2 & 1) == 0) {
          tVar3 = t_const_value::get_type(const_val);
          if (tVar3 == CV_IDENTIFIER) {
            uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])();
            if ((uVar2 & 1) == 0) {
              t_const_value::get_identifier_abi_cxx11_(&local_190,const_val);
              this_00 = get_constant(this,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              local_170 = this_00;
              if (this_00 == (t_const *)0x0) {
                const_type._7_1_ = 1;
                pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                t_const_value::get_identifier_abi_cxx11_(&local_1d0,const_val);
                std::operator+(&local_1b0,"No enum value or constant found named \"",&local_1d0);
                std::operator+(pbVar7,&local_1b0,"\"!");
                const_type._7_1_ = 0;
                __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              ptVar8 = t_const::get_type(this_00);
              local_1e0 = (t_base_type *)t_type::get_true_type(ptVar8);
              uVar2 = (*(local_1e0->super_t_type).super_t_doc._vptr_t_doc[5])();
              if ((uVar2 & 1) == 0) {
                uVar2 = (*(local_1e0->super_t_type).super_t_doc._vptr_t_doc[0x10])();
                if ((uVar2 & 1) == 0) {
                  uVar2 = (*(local_1e0->super_t_type).super_t_doc._vptr_t_doc[0xe])();
                  if ((uVar2 & 1) != 0) {
                    ptVar11 = t_const::get_value(local_170);
                    v_iter_5._M_current = (t_const_value **)t_const_value::get_list(ptVar11);
                    __gnu_cxx::
                    __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                    ::__normal_iterator(&local_230);
                    t_const_value::set_list(const_val);
                    local_238 = (t_const_value **)
                                std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::
                                begin(v_iter_5._M_current);
                    local_230._M_current = local_238;
                    while( true ) {
                      tenum = (t_enum *)
                              std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                                        ((vector<t_const_value_*,_std::allocator<t_const_value_*>_>
                                          *)v_iter_5._M_current);
                      bVar1 = __gnu_cxx::operator!=
                                        (&local_230,
                                         (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                          *)&tenum);
                      if (!bVar1) break;
                      pptVar12 = __gnu_cxx::
                                 __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                                 ::operator*(&local_230);
                      t_const_value::add_list(const_val,*pptVar12);
                      __gnu_cxx::
                      __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                      ::operator++(&local_230);
                    }
                  }
                }
                else {
                  ptVar11 = t_const::get_value(local_170);
                  v_iter_4._M_node = (_Base_ptr)t_const_value::get_map(ptVar11);
                  std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                  _Rb_tree_const_iterator(&local_210);
                  t_const_value::set_map(const_val);
                  local_218 = (_Base_ptr)
                              std::
                              map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              ::begin(v_iter_4._M_node);
                  local_210._M_node = local_218;
                  while( true ) {
                    val_2 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                            std::
                            map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                            ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                                   *)v_iter_4._M_node);
                    bVar1 = std::operator!=(&local_210,(_Self *)&val_2);
                    if (!bVar1) break;
                    ppVar10 = std::
                              _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                              ::operator->(&local_210);
                    ptVar11 = ppVar10->first;
                    ppVar10 = std::
                              _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                              ::operator->(&local_210);
                    t_const_value::add_map(const_val,ptVar11,ppVar10->second);
                    std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                    ::operator++(&local_210);
                  }
                }
              }
              else {
                tVar4 = t_base_type::get_base(local_1e0);
                switch(tVar4) {
                case TYPE_VOID:
                  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar9 = "Constants cannot be of type VOID";
                  __cxa_throw(puVar9,&char_const*::typeinfo,0);
                case TYPE_STRING:
                  ptVar11 = t_const::get_value(local_170);
                  t_const_value::get_string_abi_cxx11_((string *)&map_2,ptVar11);
                  t_const_value::set_string(const_val,(string *)&map_2);
                  std::__cxx11::string::~string((string *)&map_2);
                  break;
                case TYPE_BOOL:
                case TYPE_I8:
                case TYPE_I16:
                case TYPE_I32:
                case TYPE_I64:
                  ptVar11 = t_const::get_value(local_170);
                  iVar13 = t_const_value::get_integer(ptVar11);
                  t_const_value::set_integer(const_val,iVar13);
                  break;
                case TYPE_DOUBLE:
                  ptVar11 = t_const::get_value(local_170);
                  val_00 = t_const_value::get_double(ptVar11);
                  t_const_value::set_double(const_val,val_00);
                }
              }
            }
            else {
              t_const_value::set_enum(const_val,(t_enum *)ttype);
            }
          }
          else {
            uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])();
            if ((uVar2 & 1) != 0) {
              iVar13 = t_const_value::get_integer(const_val);
              valstm._368_8_ = t_enum::get_constant_by_value((t_enum *)ttype,iVar13);
              if ((t_enum_value *)valstm._368_8_ == (t_enum_value *)0x0) {
                std::__cxx11::ostringstream::ostringstream(local_3c8);
                iVar13 = t_const_value::get_integer(const_val);
                std::ostream::operator<<(local_3c8,iVar13);
                local_429 = 1;
                pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
                std::operator+(&local_408,"Couldn\'t find a named value in enum ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var_00,iVar5));
                std::operator+(&local_3e8,&local_408," for value ");
                std::__cxx11::ostringstream::str();
                std::operator+(pbVar7,&local_3e8,&local_428);
                local_429 = 0;
                __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_470,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_01,iVar5),".");
              __rhs = t_enum_value::get_name_abi_cxx11_((t_enum_value *)valstm._368_8_);
              std::operator+(&local_450,&local_470,__rhs);
              t_const_value::set_identifier(const_val,&local_450);
              std::__cxx11::string::~string((string *)&local_450);
              std::__cxx11::string::~string((string *)&local_470);
              t_const_value::set_enum(const_val,(t_enum *)ttype);
            }
          }
        }
        else {
          v_iter_3._M_node = (_Base_ptr)t_const_value::get_map(const_val);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_98);
          local_a0 = (_Base_ptr)
                     std::
                     map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                     ::begin(v_iter_3._M_node);
          local_98._M_node = local_a0;
          while( true ) {
            field = (t_field *)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                           *)v_iter_3._M_node);
            bVar1 = std::operator!=(&local_98,(_Self *)&field);
            if (!bVar1) break;
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_98);
            t_const_value::get_string_abi_cxx11_(&local_d0,ppVar10->first);
            ptVar6 = t_struct::get_field_by_name((t_struct *)ttype,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            local_b0 = ptVar6;
            if (ptVar6 == (t_field *)0x0) {
              constant._7_1_ = 1;
              pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              ppVar10 = std::
                        _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                        operator->(&local_98);
              t_const_value::get_string_abi_cxx11_(&local_160,ppVar10->first);
              std::operator+(&local_140,"No field named \"",&local_160);
              std::operator+(&local_120,&local_140,"\" was found in struct of type \"");
              iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_100,&local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar5));
              std::operator+(pbVar7,&local_100,"\"");
              constant._7_1_ = 0;
              __cxa_throw(pbVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_98);
            ptVar11 = ppVar10->second;
            ptVar8 = t_field::get_type(local_b0);
            resolve_const_value(this,ptVar11,ptVar8);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_98);
          }
        }
      }
      else {
        v_iter_2._M_current = (t_const_value **)t_const_value::get_list(const_val);
        __gnu_cxx::
        __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
        ::__normal_iterator(&local_70);
        local_78 = (t_const_value **)
                   std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                             (v_iter_2._M_current);
        local_70._M_current = local_78;
        while( true ) {
          tstruct = (t_struct *)
                    std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                              ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                               v_iter_2._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_70,
                             (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                              *)&tstruct);
          if (!bVar1) break;
          pptVar12 = __gnu_cxx::
                     __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                     ::operator*(&local_70);
          ptVar11 = *pptVar12;
          ptVar8 = t_set::get_elem_type((t_set *)ttype);
          resolve_const_value(this,ptVar11,ptVar8);
          __gnu_cxx::
          __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
          ::operator++(&local_70);
        }
      }
    }
    else {
      v_iter_1._M_current = (t_const_value **)t_const_value::get_list(const_val);
      __gnu_cxx::
      __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
      ::__normal_iterator(&local_50);
      local_58 = (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                           (v_iter_1._M_current);
      local_50._M_current = local_58;
      while( true ) {
        val_1 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                          ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                           v_iter_1._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                            *)&val_1);
        if (!bVar1) break;
        pptVar12 = __gnu_cxx::
                   __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                   ::operator*(&local_50);
        ptVar11 = *pptVar12;
        ptVar8 = t_list::get_elem_type((t_list *)ttype);
        resolve_const_value(this,ptVar11,ptVar8);
        __gnu_cxx::
        __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
        ::operator++(&local_50);
      }
    }
  }
  else {
    v_iter._M_node = (_Base_ptr)t_const_value::get_map(const_val);
    std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
    _Rb_tree_const_iterator(&local_30);
    local_38 = (_Base_ptr)
               std::
               map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
               ::begin(v_iter._M_node);
    local_30._M_node = local_38;
    while( true ) {
      val = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
            std::
            map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
            ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                   *)v_iter._M_node);
      bVar1 = std::operator!=(&local_30,(_Self *)&val);
      if (!bVar1) break;
      ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                operator->(&local_30);
      ptVar11 = ppVar10->first;
      ptVar8 = t_map::get_key_type((t_map *)ttype);
      resolve_const_value(this,ptVar11,ptVar8);
      ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                operator->(&local_30);
      ptVar11 = ppVar10->second;
      ptVar8 = t_map::get_val_type((t_map *)ttype);
      resolve_const_value(this,ptVar11,ptVar8);
      std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::operator++
                (&local_30);
    }
  }
  return;
}

Assistant:

void resolve_const_value(t_const_value* const_val, t_type* ttype) {
    if (ttype->is_map()) {
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        resolve_const_value(v_iter->first, ((t_map*)ttype)->get_key_type());
        resolve_const_value(v_iter->second, ((t_map*)ttype)->get_val_type());
      }
    } else if (ttype->is_list()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_list*)ttype)->get_elem_type());
      }
    } else if (ttype->is_set()) {
      const std::vector<t_const_value*>& val = const_val->get_list();
      std::vector<t_const_value*>::const_iterator v_iter;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        resolve_const_value((*v_iter), ((t_set*)ttype)->get_elem_type());
      }
    } else if (ttype->is_struct()) {
      auto* tstruct = (t_struct*)ttype;
      const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = const_val->get_map();
      std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
      for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
        t_field* field = tstruct->get_field_by_name(v_iter->first->get_string());
        if (field == nullptr) {
          throw "No field named \"" + v_iter->first->get_string()
              + "\" was found in struct of type \"" + tstruct->get_name() + "\"";
        }
        resolve_const_value(v_iter->second, field->get_type());
      }
    } else if (const_val->get_type() == t_const_value::CV_IDENTIFIER) {
      if (ttype->is_enum()) {
        const_val->set_enum((t_enum*)ttype);
      } else {
        t_const* constant = get_constant(const_val->get_identifier());
        if (constant == nullptr) {
          throw "No enum value or constant found named \"" + const_val->get_identifier() + "\"!";
        }

        // Resolve typedefs to the underlying type
        t_type* const_type = constant->get_type()->get_true_type();

        if (const_type->is_base_type()) {
          switch (((t_base_type*)const_type)->get_base()) {
          case t_base_type::TYPE_I16:
          case t_base_type::TYPE_I32:
          case t_base_type::TYPE_I64:
          case t_base_type::TYPE_BOOL:
          case t_base_type::TYPE_I8:
            const_val->set_integer(constant->get_value()->get_integer());
            break;
          case t_base_type::TYPE_STRING:
            const_val->set_string(constant->get_value()->get_string());
            break;
          case t_base_type::TYPE_DOUBLE:
            const_val->set_double(constant->get_value()->get_double());
            break;
          case t_base_type::TYPE_VOID:
            throw "Constants cannot be of type VOID";
          }
        } else if (const_type->is_map()) {
          const std::map<t_const_value*, t_const_value*, t_const_value::value_compare>& map = constant->get_value()->get_map();
          std::map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

          const_val->set_map();
          for (v_iter = map.begin(); v_iter != map.end(); ++v_iter) {
            const_val->add_map(v_iter->first, v_iter->second);
          }
        } else if (const_type->is_list()) {
          const std::vector<t_const_value*>& val = constant->get_value()->get_list();
          std::vector<t_const_value*>::const_iterator v_iter;

          const_val->set_list();
          for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
            const_val->add_list(*v_iter);
          }
        }
      }
    } else if (ttype->is_enum()) {
      // enum constant with non-identifier value. set the enum and find the
      // value's name.
      auto* tenum = (t_enum*)ttype;
      t_enum_value* enum_value = tenum->get_constant_by_value(const_val->get_integer());
      if (enum_value == nullptr) {
        std::ostringstream valstm;
        valstm << const_val->get_integer();
        throw "Couldn't find a named value in enum " + tenum->get_name() + " for value "
            + valstm.str();
      }
      const_val->set_identifier(tenum->get_name() + "." + enum_value->get_name());
      const_val->set_enum(tenum);
    }
  }